

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O1

ethash_h256_t * ethash_get_seedhash(ethash_h256_t *__return_storage_ptr__,uint64_t block_number)

{
  bool bVar1;
  ulong uVar2;
  
  __return_storage_ptr__->b[0x10] = '\0';
  __return_storage_ptr__->b[0x11] = '\0';
  __return_storage_ptr__->b[0x12] = '\0';
  __return_storage_ptr__->b[0x13] = '\0';
  __return_storage_ptr__->b[0x14] = '\0';
  __return_storage_ptr__->b[0x15] = '\0';
  __return_storage_ptr__->b[0x16] = '\0';
  __return_storage_ptr__->b[0x17] = '\0';
  __return_storage_ptr__->b[0x18] = '\0';
  __return_storage_ptr__->b[0x19] = '\0';
  __return_storage_ptr__->b[0x1a] = '\0';
  __return_storage_ptr__->b[0x1b] = '\0';
  __return_storage_ptr__->b[0x1c] = '\0';
  __return_storage_ptr__->b[0x1d] = '\0';
  __return_storage_ptr__->b[0x1e] = '\0';
  __return_storage_ptr__->b[0x1f] = '\0';
  __return_storage_ptr__->b[0] = '\0';
  __return_storage_ptr__->b[1] = '\0';
  __return_storage_ptr__->b[2] = '\0';
  __return_storage_ptr__->b[3] = '\0';
  __return_storage_ptr__->b[4] = '\0';
  __return_storage_ptr__->b[5] = '\0';
  __return_storage_ptr__->b[6] = '\0';
  __return_storage_ptr__->b[7] = '\0';
  __return_storage_ptr__->b[8] = '\0';
  __return_storage_ptr__->b[9] = '\0';
  __return_storage_ptr__->b[10] = '\0';
  __return_storage_ptr__->b[0xb] = '\0';
  __return_storage_ptr__->b[0xc] = '\0';
  __return_storage_ptr__->b[0xd] = '\0';
  __return_storage_ptr__->b[0xe] = '\0';
  __return_storage_ptr__->b[0xf] = '\0';
  if (29999 < block_number) {
    uVar2 = 1;
    do {
      sha3_256(__return_storage_ptr__->b,0x20,__return_storage_ptr__->b,0x20);
      bVar1 = uVar2 < block_number / 30000;
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

ethash_h256_t ethash_get_seedhash(uint64_t block_number)
{
	ethash_h256_t ret;
	ethash_h256_reset(&ret);
	uint64_t const epochs = block_number / ETHASH_EPOCH_LENGTH;
	for (uint32_t i = 0; i < epochs; ++i)
		SHA3_256(&ret, (uint8_t*)&ret, 32);
	return ret;
}